

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderMatrixTests.cpp
# Opt level: O1

void deqp::gles3::Functional::MatrixCaseUtils::Evaluator<10,_6,_94>::evaluate
               (ShaderEvalContext *evalCtx,InputType in0Type,InputType in1Type)

{
  undefined8 uVar1;
  int i;
  undefined8 *puVar2;
  long lVar3;
  undefined4 *puVar4;
  long lVar5;
  Matrix<float,_3,_2> *mat;
  long lVar6;
  undefined8 *puVar7;
  undefined4 uVar8;
  Vector<float,_3> res;
  Type in0;
  float afStack_70 [6];
  undefined8 local_58;
  float fStack_50;
  undefined4 uStack_4c;
  undefined4 uStack_48;
  float fStack_44;
  int local_38 [6];
  Matrix<float,_3,_2> local_20;
  
  puVar2 = &local_58;
  if (in0Type == INPUTTYPE_DYNAMIC) {
    lVar3 = 0;
    lVar5 = 0;
    do {
      lVar6 = 0;
      do {
        uVar8 = 0x3f800000;
        if (lVar3 != lVar6) {
          uVar8 = 0;
        }
        *(undefined4 *)((long)puVar2 + lVar6) = uVar8;
        lVar6 = lVar6 + 0xc;
      } while (lVar6 == 0xc);
      lVar5 = lVar5 + 1;
      puVar2 = (undefined8 *)((long)puVar2 + 4);
      lVar3 = lVar3 + 0xc;
    } while (lVar5 != 3);
    local_58 = *(undefined8 *)evalCtx->in[0].m_data;
    fStack_50 = evalCtx->in[0].m_data[2];
    uVar1 = *(undefined8 *)evalCtx->in[1].m_data;
    fStack_44 = evalCtx->in[1].m_data[2];
    uStack_4c = (undefined4)uVar1;
    uStack_48 = (undefined4)((ulong)uVar1 >> 0x20);
    mat = (Matrix<float,_3,_2> *)0x3;
  }
  else {
    local_58 = 0;
    fStack_50 = 0.0;
    uStack_4c = 0;
    uStack_48 = 0;
    fStack_44 = 0.0;
    puVar4 = &s_constInMat2x3;
    mat = (Matrix<float,_3,_2> *)0x0;
    do {
      lVar3 = 0;
      puVar7 = puVar2;
      do {
        *(undefined4 *)puVar7 = puVar4[lVar3];
        lVar3 = lVar3 + 1;
        puVar7 = (undefined8 *)((long)puVar7 + 0xc);
      } while (lVar3 == 1);
      mat = (Matrix<float,_3,_2> *)((long)(mat->m_data).m_data[0].m_data + 1);
      puVar2 = (undefined8 *)((long)puVar2 + 4);
      puVar4 = puVar4 + 2;
    } while (mat != (Matrix<float,_3,_2> *)0x3);
  }
  afStack_70[0] = 2.580086e-38;
  afStack_70[1] = 0.0;
  negate<float,3,2>(&local_20,(MatrixCaseUtils *)&local_58,mat);
  afStack_70[4] = 0.0;
  afStack_70[2] = 0.0;
  afStack_70[3] = 0.0;
  lVar3 = 0;
  do {
    afStack_70[lVar3 + 2] =
         local_20.m_data.m_data[0].m_data[lVar3] + local_20.m_data.m_data[1].m_data[lVar3];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 3);
  local_38[2] = 0;
  local_38[3] = 1;
  local_38[4] = 2;
  lVar3 = 2;
  do {
    (evalCtx->color).m_data[local_38[lVar3]] = afStack_70[lVar3];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 5);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx, InputType in0Type, InputType in1Type)
	{
		DE_UNREF(in1Type);
		typename TypeTraits<In0DataType>::Type	in0	= (in0Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In0DataType>(evalCtx, 0)
																				     : getInputValue<INPUTTYPE_CONST,	In0DataType>(evalCtx, 0);
		evalCtx.color.xyz() = reduceToVec3(negate(in0));
	}